

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

void get_remote_block_neg
               (Integer idx,Integer ndim,Integer *lo_loc,Integer *hi_loc,Integer *slo_rem,
               Integer *shi_rem,Integer *dims,Integer *width)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  Integer IVar4;
  long *plVar5;
  long local_88;
  Integer hi_rem [7];
  long lStack_48;
  Integer lo_rem [7];
  
  if (0 < ndim) {
    lVar3 = 0;
    do {
      lVar1 = lo_loc[lVar3];
      if (idx == lVar3) {
        lo_rem[lVar3 + -1] = lVar1 - width[lVar3];
        IVar4 = lVar1 + -1;
      }
      else {
        lo_rem[lVar3 + -1] = lVar1;
        IVar4 = hi_loc[lVar3];
      }
      hi_rem[lVar3 + -1] = IVar4;
      lVar3 = lVar3 + 1;
    } while (ndim != lVar3);
  }
  if (0 < ndim) {
    plVar2 = &local_88;
    lVar3 = 0;
    do {
      lVar1 = lo_rem[lVar3 + -1];
      if (idx == lVar3) {
        if (lVar1 < 1) {
          plVar5 = dims + lVar3;
          slo_rem[lVar3] = (*plVar5 - width[lVar3]) + 1;
        }
        else {
          slo_rem[lVar3] = lVar1;
          plVar5 = plVar2;
        }
      }
      else {
        slo_rem[lVar3] = lVar1;
        plVar5 = hi_rem + lVar3 + -1;
      }
      shi_rem[lVar3] = *plVar5;
      lVar3 = lVar3 + 1;
      plVar2 = plVar2 + 1;
    } while (ndim != lVar3);
  }
  return;
}

Assistant:

static void get_remote_block_neg(Integer idx, Integer ndim, Integer *lo_loc,
                          Integer *hi_loc, Integer *slo_rem, Integer *shi_rem,
                          Integer *dims, Integer *width)
{
  Integer i, lo_rem[MAXDIM], hi_rem[MAXDIM];
  /*Start by getting rough idea of where data needs to go. */
  for (i = 0; i < ndim; i++) {
    if (i == idx) {
      lo_rem[i] = lo_loc[i] - width[i];
      hi_rem[i] = lo_loc[i] - 1;
    } else {
      lo_rem[i] = lo_loc[i];
      hi_rem[i] = hi_loc[i];
    }
  }

  /* Account for boundaries, if necessary. */
  for (i=0; i<ndim; i++) {
    if (i == idx) {
      if (lo_rem[i] < 1) {
        slo_rem[i] = dims[i] - width[i] + 1;
        shi_rem[i] = dims[i];
      } else {
        slo_rem[i] = lo_rem[i];
        shi_rem[i] = hi_rem[i];
      }
    } else {
      slo_rem[i] = lo_rem[i];
      shi_rem[i] = hi_rem[i];
    }
  }
}